

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
::SPxLPBase<double>(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *this,SPxLPBase<double> *old)

{
  long in_RSI;
  LPRowSetBase<double> *in_RDI;
  bool bVar1;
  longdouble in_stack_00000030;
  shared_ptr<soplex::Tolerances> *psVar2;
  undefined2 uVar3;
  undefined6 in_stack_ffffffffffffff82;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_ffffffffffffffb0;
  
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPRowSetBase<double>(in_stack_ffffffffffffffb0,in_RDI);
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPColSetBase<double>
            ((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              *)in_stack_ffffffffffffffb0,(LPColSetBase<double> *)in_RDI);
  (in_RDI->super_SVSetBase<double>).super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray =
       (_func_int **)&PTR__SPxLPBase_00895180;
  in_RDI[1].super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray =
       (_func_int **)&PTR__SPxLPBase_00895420;
  bVar1 = *(int *)(in_RSI + 400) != -1;
  *(uint *)&in_RDI[2].super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
            _vptr_ClassArray = (bVar1 - 1) + (uint)bVar1;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x435635);
  psVar2 = SUB108((longdouble)*(double *)(in_RSI + 0x198),0);
  uVar3 = (undefined2)((unkuint10)(longdouble)*(double *)(in_RSI + 0x198) >> 0x40);
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               *)old,in_stack_00000030);
  in_RDI[2].super_SVSetBase<double>.list.super_IsList<soplex::SVSetBase<double>::DLPSV>.
  destroyElements = (bool)(*(byte *)(in_RSI + 0x1a0) & 1);
  in_RDI[2].super_SVSetBase<double>.factor = *(double *)(in_RSI + 0x1b0);
  std::shared_ptr<soplex::Tolerances>::shared_ptr((shared_ptr<soplex::Tolerances> *)0x4356c7);
  in_RDI[2].super_SVSetBase<double>.unusedMem = 0;
  in_RDI[2].super_SVSetBase<double>.numUnusedMemUpdates = 0;
  std::shared_ptr<soplex::Tolerances>::operator=
            ((shared_ptr<soplex::Tolerances> *)CONCAT62(in_stack_ffffffffffffff82,uVar3),psVar2);
  return;
}

Assistant:

SPxLPBase(const SPxLPBase<S>& old)
      : LPRowSetBase<R>(old)
      , LPColSetBase<R>(old)
      , thesense(old.thesense == SPxLPBase<S>::MINIMIZE ? SPxLPBase<R>::MINIMIZE : SPxLPBase<R>::MAXIMIZE)
      , offset(old.offset)
      , _isScaled(old._isScaled)
      , spxout(old.spxout)
   {
      lp_scaler = nullptr;
      _tolerances = old._tolerances;
      assert(isConsistent());
   }